

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::GetFrustumLeftPlane(ON_Viewport *this,ON_Plane *left_plane)

{
  bool bVar1;
  byte local_109;
  ON_3dVector local_108;
  ON_3dVector local_f0;
  ON_3dPoint local_d8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  undefined1 local_30 [8];
  ON_2dVector v;
  bool rc;
  ON_Plane *left_plane_local;
  ON_Viewport *this_local;
  
  local_109 = 0;
  if ((this->m_bValidCamera & 1U) != 0) {
    local_109 = this->m_bValidFrustum;
  }
  v.y._7_1_ = local_109 & 1;
  if (v.y._7_1_ != 0) {
    bVar1 = IsPerspectiveProjection(this);
    if (bVar1) {
      ON_2dVector::ON_2dVector((ON_2dVector *)local_30,this->m_frus_near,this->m_frus_left);
      v.y._7_1_ = ON_2dVector::Unitize((ON_2dVector *)local_30);
      (left_plane->origin).x = (this->m_CamLoc).x;
      (left_plane->origin).y = (this->m_CamLoc).y;
      (left_plane->origin).z = (this->m_CamLoc).z;
      ::operator*(&local_60,v.x,&this->m_CamX);
      ::operator*(&local_78,(double)local_30,&this->m_CamZ);
      ON_3dVector::operator-(&local_48,&local_60,&local_78);
      (left_plane->xaxis).x = local_48.x;
      (left_plane->xaxis).y = local_48.y;
      (left_plane->xaxis).z = local_48.z;
      (left_plane->yaxis).x = (this->m_CamY).x;
      (left_plane->yaxis).y = (this->m_CamY).y;
      (left_plane->yaxis).z = (this->m_CamY).z;
      ::operator*(&local_a8,(double)local_30,&this->m_CamX);
      ::operator*(&local_c0,v.x,&this->m_CamZ);
      ON_3dVector::operator+(&local_90,&local_a8,&local_c0);
      (left_plane->zaxis).x = local_90.x;
      (left_plane->zaxis).y = local_90.y;
      (left_plane->zaxis).z = local_90.z;
    }
    else {
      ::operator*(&local_f0,this->m_frus_left,&this->m_CamX);
      ON_3dPoint::operator+(&local_d8,&this->m_CamLoc,&local_f0);
      (left_plane->origin).x = local_d8.x;
      (left_plane->origin).y = local_d8.y;
      (left_plane->origin).z = local_d8.z;
      ON_3dVector::operator-(&local_108,&this->m_CamZ);
      (left_plane->xaxis).x = local_108.x;
      (left_plane->xaxis).y = local_108.y;
      (left_plane->xaxis).z = local_108.z;
      (left_plane->yaxis).x = (this->m_CamY).x;
      (left_plane->yaxis).y = (this->m_CamY).y;
      (left_plane->yaxis).z = (this->m_CamY).z;
      (left_plane->zaxis).x = (this->m_CamX).x;
      (left_plane->zaxis).y = (this->m_CamX).y;
      (left_plane->zaxis).z = (this->m_CamX).z;
    }
    ON_Plane::UpdateEquation(left_plane);
  }
  return (bool)(v.y._7_1_ & 1);
}

Assistant:

bool ON_Viewport::GetFrustumLeftPlane( 
  ON_Plane& left_plane 
  ) const
{
  bool rc = m_bValidCamera && m_bValidFrustum;
  if (rc)
  {
    if ( IsPerspectiveProjection() )
    {
      ON_2dVector v(m_frus_near,m_frus_left);
      rc = v.Unitize();
      left_plane.origin = m_CamLoc;
      left_plane.xaxis =  v.y*m_CamX - v.x*m_CamZ;
      left_plane.yaxis =  m_CamY;
      left_plane.zaxis =  v.x*m_CamX + v.y*m_CamZ;
    }
    else
    {
      left_plane.origin = m_CamLoc + m_frus_left*m_CamX;
      left_plane.xaxis = -m_CamZ;
      left_plane.yaxis =  m_CamY;
      left_plane.zaxis =  m_CamX;
    }
    left_plane.UpdateEquation();
  }
  return rc;
}